

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O3

void quicly_remote_cid_init_set
               (quicly_remote_cid_set_t *set,ptls_iovec_t *initial_cid,
               _func_void_void_ptr_size_t *random_bytes)

{
  size_t __n;
  quicly_remote_cid_t *pqVar1;
  st_quicly_cid_t *psVar2;
  long lVar3;
  
  set->cids[0].is_active = 1;
  *(undefined8 *)&set->cids[0].field_0x4 = 0;
  *(undefined8 *)((long)&set->cids[0].sequence + 4) = 0;
  pqVar1 = set->cids;
  (pqVar1->cid).cid[4] = '\0';
  (pqVar1->cid).cid[5] = '\0';
  (pqVar1->cid).cid[6] = '\0';
  (pqVar1->cid).cid[7] = '\0';
  (pqVar1->cid).cid[8] = '\0';
  (pqVar1->cid).cid[9] = '\0';
  (pqVar1->cid).cid[10] = '\0';
  (pqVar1->cid).cid[0xb] = '\0';
  pqVar1 = set->cids;
  (pqVar1->cid).cid[0xc] = '\0';
  (pqVar1->cid).cid[0xd] = '\0';
  (pqVar1->cid).cid[0xe] = '\0';
  (pqVar1->cid).cid[0xf] = '\0';
  (pqVar1->cid).cid[0x10] = '\0';
  (pqVar1->cid).cid[0x11] = '\0';
  (pqVar1->cid).cid[0x12] = '\0';
  (pqVar1->cid).cid[0x13] = '\0';
  *(undefined8 *)&set->cids[0].cid.len = 0;
  set->cids[0].stateless_reset_token[7] = '\0';
  set->cids[0].stateless_reset_token[8] = '\0';
  set->cids[0].stateless_reset_token[9] = '\0';
  set->cids[0].stateless_reset_token[10] = '\0';
  set->cids[0].stateless_reset_token[0xb] = '\0';
  set->cids[0].stateless_reset_token[0xc] = '\0';
  set->cids[0].stateless_reset_token[0xd] = '\0';
  set->cids[0].stateless_reset_token[0xe] = '\0';
  *(undefined4 *)(set->cids[0].stateless_reset_token + 0xf) = 0;
  psVar2 = &set->cids[0].cid;
  if (initial_cid == (ptls_iovec_t *)0x0) {
    (*random_bytes)(psVar2,8);
    set->cids[0].cid.len = '\b';
  }
  else {
    __n = initial_cid->len;
    memcpy(psVar2,initial_cid->base,__n);
    set->cids[0].cid.len = (uint8_t)__n;
  }
  (*random_bytes)(set->cids[0].stateless_reset_token,0x10);
  psVar2 = &set->cids[1].cid;
  lVar3 = 1;
  do {
    *(undefined8 *)((long)(psVar2 + -1) + 5) = 0;
    *(long *)((long)(psVar2 + -1) + 0xd) = lVar3;
    psVar2->cid[0] = '\0';
    psVar2->cid[1] = '\0';
    psVar2->cid[2] = '\0';
    psVar2->cid[3] = '\0';
    psVar2->cid[4] = '\0';
    psVar2->cid[5] = '\0';
    psVar2->cid[6] = '\0';
    psVar2->cid[7] = '\0';
    psVar2->cid[8] = '\0';
    psVar2->cid[9] = '\0';
    psVar2->cid[10] = '\0';
    psVar2->cid[0xb] = '\0';
    psVar2->cid[0xc] = '\0';
    psVar2->cid[0xd] = '\0';
    psVar2->cid[0xe] = '\0';
    psVar2->cid[0xf] = '\0';
    *(undefined8 *)(psVar2->cid + 0x10) = 0;
    psVar2[1].cid[3] = '\0';
    psVar2[1].cid[4] = '\0';
    psVar2[1].cid[5] = '\0';
    psVar2[1].cid[6] = '\0';
    psVar2[1].cid[7] = '\0';
    psVar2[1].cid[8] = '\0';
    psVar2[1].cid[9] = '\0';
    psVar2[1].cid[10] = '\0';
    *(undefined8 *)((long)(psVar2 + 1) + 0xb) = 0;
    lVar3 = lVar3 + 1;
    psVar2 = (st_quicly_cid_t *)((long)(psVar2 + 2) + 0xe);
  } while (lVar3 != 4);
  set->_largest_sequence_expected = 3;
  return;
}

Assistant:

void quicly_remote_cid_init_set(quicly_remote_cid_set_t *set, ptls_iovec_t *initial_cid, void (*random_bytes)(void *, size_t))
{
    set->cids[0] = (quicly_remote_cid_t){
        .is_active = 1,
        .sequence = 0,
    };
    if (initial_cid != NULL) {
        quicly_set_cid(&set->cids[0].cid, *initial_cid);
    } else {
        random_bytes(set->cids[0].cid.cid, QUICLY_MIN_INITIAL_DCID_LEN);
        set->cids[0].cid.len = QUICLY_MIN_INITIAL_DCID_LEN;
    }
    random_bytes(set->cids[0].stateless_reset_token, sizeof(set->cids[0].stateless_reset_token));

    for (size_t i = 1; i < PTLS_ELEMENTSOF(set->cids); i++)
        set->cids[i] = (quicly_remote_cid_t){
            .is_active = 0,
            .sequence = i,
        };

    set->_largest_sequence_expected = PTLS_ELEMENTSOF(set->cids) - 1;
}